

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall pybind11::error_already_set::~error_already_set(error_already_set *this)

{
  object *this_00;
  gil_scoped_acquire gil;
  error_scope scope;
  handle local_40;
  gil_scoped_acquire local_38;
  error_scope local_28;
  
  *(undefined ***)this = &PTR__error_already_set_0012e9e0;
  this_00 = &this->m_type;
  if ((this->m_type).super_handle.m_ptr != (PyObject *)0x0) {
    gil_scoped_acquire::gil_scoped_acquire(&local_38);
    error_scope::error_scope(&local_28);
    local_40.m_ptr = (this_00->super_handle).m_ptr;
    (this_00->super_handle).m_ptr = (PyObject *)0x0;
    handle::dec_ref(&local_40);
    local_40.m_ptr = (this->m_value).super_handle.m_ptr;
    (this->m_value).super_handle.m_ptr = (PyObject *)0x0;
    handle::dec_ref(&local_40);
    local_40.m_ptr = (this->m_trace).super_handle.m_ptr;
    (this->m_trace).super_handle.m_ptr = (PyObject *)0x0;
    handle::dec_ref(&local_40);
    error_scope::~error_scope(&local_28);
    gil_scoped_acquire::~gil_scoped_acquire(&local_38);
  }
  object::~object(&this->m_trace);
  object::~object(&this->m_value);
  object::~object(this_00);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

error_already_set::~error_already_set() {
    if (m_type) {
        gil_scoped_acquire gil;
        error_scope scope;
        m_type.release().dec_ref();
        m_value.release().dec_ref();
        m_trace.release().dec_ref();
    }
}